

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O2

void __thiscall
flow::BinaryInstr<(flow::BinaryOperator)2,_(flow::LiteralType)2>::BinaryInstr
          (BinaryInstr<(flow::BinaryOperator)2,_(flow::LiteralType)2> *this,Value *lhs,Value *rhs,
          string *name)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_41;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  Value *local_28;
  Value *local_20;
  
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_28 = lhs;
  local_20 = rhs;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_40,__l,&local_41);
  Instr::Instr(&this->super_Instr,Number,
               (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_40,name);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_40);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__Instr_0019b5f0;
  this->operator_ = IMul;
  return;
}

Assistant:

BinaryInstr(Value* lhs, Value* rhs, const std::string& name)
      : Instr(ResultType, {lhs, rhs}, name), operator_(Operator) {}